

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall
GdlUnaryExpression::ResolveToInteger(GdlUnaryExpression *this,int *pnRet,bool fSlotRef)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  int nTmp;
  allocator local_65;
  int local_64;
  string local_60;
  string local_40;
  
  iVar3 = (*this->m_pexpOperand->_vptr_GdlExpression[7])
                    (this->m_pexpOperand,&local_64,CONCAT71(in_register_00000011,fSlotRef));
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_40,"!",&local_65);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      uVar4 = (uint)(local_64 == 0);
    }
    else {
      pGVar1 = this->m_psymOperator;
      std::__cxx11::string::string((string *)&local_60,"-",&local_65);
      bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (!bVar2) {
        return false;
      }
      uVar4 = -local_64;
    }
    *pnRet = uVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool GdlUnaryExpression::ResolveToInteger(int * pnRet, bool fSlotRef)
{

	int nTmp;
	if (!m_pexpOperand->ResolveToInteger(&nTmp, fSlotRef))
		return false;

	if (m_psymOperator->MatchesOp("!"))
		*pnRet = (nTmp == 0)? 1: 0;
	else if (m_psymOperator->MatchesOp("-"))
		*pnRet = nTmp * -1;
	else
		return false;

	return true;
}